

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteLoop<signed_char,short,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (char *ldata,short *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ulong *puVar1;
  sel_t *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t idx_in_entry;
  ulong uVar10;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  short *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = sel_vector->sel_vector;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar2 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar2[iVar8];
        }
        result_data[iVar8] = (short)ldata[iVar9];
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
  }
  else if (count != 0) {
    psVar2 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar10 = 0;
    local_40 = result_data;
    do {
      uVar6 = uVar10;
      if (psVar2 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar2[uVar10];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) == 0) {
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var5 = p_Stack_50;
          peVar4 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          result_data = local_40;
        }
        bVar3 = (byte)uVar10 & 0x3f;
        puVar1 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar10 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      else {
        result_data[uVar10] = (short)ldata[uVar6];
      }
      uVar10 = uVar10 + 1;
    } while (count != uVar10);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}